

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O0

void __thiscall
diy::stats::ScopedProfile<diy::stats::Profiler>::~ScopedProfile
          (ScopedProfile<diy::stats::Profiler> *this)

{
  long in_RDI;
  string *in_stack_00000008;
  Profiler *in_stack_00000010;
  string local_28 [40];
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    std::__cxx11::string::string(local_28,(string *)(in_RDI + 8));
    Profiler::operator>>(in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string(local_28);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

~ScopedProfile()                            { if (active) prof >> name; }